

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O0

bool __thiscall
btLemkeAlgorithm::validBasis(btLemkeAlgorithm *this,btAlignedObjectArray<int> *basis)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  btAlignedObjectArray<int> *in_RSI;
  int i;
  bool isValid;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    iVar1 = btAlignedObjectArray<int>::size(in_RSI);
    if (iVar1 <= local_18) {
      return true;
    }
    piVar3 = btAlignedObjectArray<int>::operator[](in_RSI,local_18);
    iVar1 = *piVar3;
    iVar2 = btAlignedObjectArray<int>::size(in_RSI);
    if (SBORROW4(iVar1,iVar2 * 2) == iVar1 + iVar2 * -2 < 0) break;
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

bool btLemkeAlgorithm::validBasis(const btAlignedObjectArray<int>& basis) 
  {
    bool isValid = true;
    for (int i = 0; i < basis.size(); i++) {
      if (basis[i] >= basis.size() * 2) { //then z0 is in the base
        isValid = false;
        break;
      }
    }

    return isValid;
  }